

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Stream::printError(Stream *this,Node *N,Twine *Msg)

{
  Twine *Message;
  pointer this_00;
  SMRange local_58;
  ArrayRef<llvm::SMRange> local_48;
  SMRange local_38;
  SMLoc local_28;
  Twine *local_20;
  Twine *Msg_local;
  Node *N_local;
  Stream *this_local;
  
  local_20 = Msg;
  Msg_local = (Twine *)N;
  N_local = (Node *)this;
  this_00 = std::unique_ptr<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>::
            operator->(&this->scanner);
  local_38 = Node::getSourceRange((Node *)Msg_local);
  Message = local_20;
  local_28.Ptr = local_38.Start.Ptr;
  local_58 = Node::getSourceRange((Node *)Msg_local);
  ArrayRef<llvm::SMRange>::ArrayRef(&local_48,&local_58);
  Scanner::printError(this_00,local_28,DK_Error,Message,local_48);
  return;
}

Assistant:

void Stream::printError(Node *N, const Twine &Msg) {
  scanner->printError( N->getSourceRange().Start
                     , SourceMgr::DK_Error
                     , Msg
                     , N->getSourceRange());
}